

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

bool __thiscall
soplex::SoPlexBase<double>::getBoundViolation
          (SoPlexBase<double> *this,double *maxviol,double *sumviol)

{
  pointer pdVar1;
  bool bVar2;
  byte bVar3;
  SPxLPBase<double> *pSVar4;
  ulong uVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar6;
  double dVar7;
  
  if ((this->_hasSolReal != true) || (((this->_solReal).field_0x98 & 1) == 0)) {
    if ((this->_hasSolRational != true) || (((this->_solRational).field_0xd0 & 1) == 0)) {
      return false;
    }
    if (this->_hasSolReal == false) {
      SolBase<double>::operator=(&this->_solReal,&this->_solRational);
      this->_hasSolReal = true;
    }
  }
  *maxviol = 0.0;
  *sumviol = 0.0;
  uVar5 = (ulong)(this->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  if (0 < (long)uVar5) {
    do {
      pSVar4 = this->_realLP;
      bVar3 = pSVar4->_isScaled;
      if ((bool)bVar3 == true) {
        (*pSVar4->lp_scaler->_vptr_SPxScaler[0x16])
                  (pSVar4->lp_scaler,pSVar4,(ulong)((int)uVar5 - 1));
        pSVar4 = this->_realLP;
        bVar3 = pSVar4->_isScaled;
        dVar7 = extraout_XMM0_Qa;
      }
      else {
        dVar7 = (pSVar4->super_LPColSetBase<double>).low.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar5 - 1];
      }
      if ((bVar3 & 1) == 0) {
        dVar6 = (pSVar4->super_LPColSetBase<double>).up.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar5 - 1];
      }
      else {
        (*pSVar4->lp_scaler->_vptr_SPxScaler[0x14])
                  (pSVar4->lp_scaler,pSVar4,(ulong)((int)uVar5 - 1));
        dVar6 = extraout_XMM0_Qa_00;
      }
      pdVar1 = (this->_solReal)._primal.val.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar7 = dVar7 - pdVar1[uVar5 + 0xffffffffffffffff];
      if ((0.0 < dVar7) && (*sumviol = *sumviol + dVar7, *maxviol <= dVar7 && dVar7 != *maxviol)) {
        *maxviol = dVar7;
      }
      dVar6 = pdVar1[uVar5 + 0xffffffffffffffff] - dVar6;
      if ((0.0 < dVar6) && (*sumviol = *sumviol + dVar6, *maxviol <= dVar6 && dVar6 != *maxviol)) {
        *maxviol = dVar6;
      }
      bVar2 = 1 < uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar2);
  }
  return true;
}

Assistant:

bool SoPlexBase<R>::getBoundViolation(R& maxviol, R& sumviol)
{
   if(!isPrimalFeasible())
      return false;

   _syncRealSolution();
   VectorBase<R>& primal = _solReal._primal;
   assert(primal.dim() == numCols());

   maxviol = 0.0;
   sumviol = 0.0;

   for(int i = numCols() - 1; i >= 0; i--)
   {
      R lower = _realLP->lowerUnscaled(i);
      R upper = _realLP->upperUnscaled(i);
      R viol = lower - primal[i];

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }

      viol = primal[i] - upper;

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }
   }

   return true;
}